

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

ALboolean alIsBuffer(ALuint name)

{
  ALboolean AVar1;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alIsBuffer);
  writele32(name);
  AVar1 = (*REAL_alIsBuffer)(name);
  writele32((int)AVar1);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return AVar1;
}

Assistant:

ALboolean alIsBuffer(ALuint name)
{
    ALboolean retval;
    IO_START(alIsBuffer);
    IO_UINT32(name);
    retval = REAL_alIsBuffer(name);
    IO_BOOLEAN(retval);
    IO_END();
    return retval;
}